

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.cc
# Opt level: O3

pid_t absl::lts_20240722::base_internal::GetCachedTID(void)

{
  pid_t *ppVar1;
  long lVar2;
  
  ppVar1 = (pid_t *)__tls_get_addr(&PTR_00105fb0);
  if ((char)ppVar1[1] != '\x01') {
    lVar2 = syscall(0xba);
    *ppVar1 = (pid_t)lVar2;
    *(undefined1 *)(ppVar1 + 1) = 1;
  }
  return *ppVar1;
}

Assistant:

pid_t GetCachedTID() {
#ifdef ABSL_HAVE_THREAD_LOCAL
  static thread_local pid_t thread_id = GetTID();
  return thread_id;
#else
  return GetTID();
#endif  // ABSL_HAVE_THREAD_LOCAL
}